

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall YAML::Parser::ParseDirectives(Parser *this)

{
  bool bVar1;
  bool bVar2;
  Token *pTVar3;
  long in_RDI;
  Token *token;
  bool readDirective;
  Token *in_stack_ffffffffffffffb8;
  Scanner *in_stack_ffffffffffffffc0;
  
  bVar1 = false;
  while( true ) {
    std::unique_ptr<YAML::Scanner,_std::default_delete<YAML::Scanner>_>::operator->
              ((unique_ptr<YAML::Scanner,_std::default_delete<YAML::Scanner>_> *)0xf13392);
    bVar2 = Scanner::empty(in_stack_ffffffffffffffc0);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    std::unique_ptr<YAML::Scanner,_std::default_delete<YAML::Scanner>_>::operator->
              ((unique_ptr<YAML::Scanner,_std::default_delete<YAML::Scanner>_> *)0xf133af);
    pTVar3 = Scanner::peek(in_stack_ffffffffffffffc0);
    if (pTVar3->type != DIRECTIVE) break;
    if (!bVar1) {
      in_stack_ffffffffffffffc0 = (Scanner *)(in_RDI + 8);
      operator_new(0x40);
      Directives::Directives((Directives *)in_stack_ffffffffffffffc0);
      std::unique_ptr<YAML::Directives,_std::default_delete<YAML::Directives>_>::reset
                ((unique_ptr<YAML::Directives,_std::default_delete<YAML::Directives>_> *)
                 in_stack_ffffffffffffffc0,(pointer)in_stack_ffffffffffffffb8);
    }
    bVar1 = true;
    HandleDirective((Parser *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::unique_ptr<YAML::Scanner,_std::default_delete<YAML::Scanner>_>::operator->
              ((unique_ptr<YAML::Scanner,_std::default_delete<YAML::Scanner>_> *)0xf13446);
    Scanner::pop(in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void Parser::ParseDirectives() {
  bool readDirective = false;

  while (!m_pScanner->empty()) {
    Token& token = m_pScanner->peek();
    if (token.type != Token::DIRECTIVE) {
      break;
    }

    // we keep the directives from the last document if none are specified;
    // but if any directives are specific, then we reset them
    if (!readDirective) {
      m_pDirectives.reset(new Directives);
    }

    readDirective = true;
    HandleDirective(token);
    m_pScanner->pop();
  }
}